

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<4>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  float fVar1;
  bool bVar2;
  qpTestResult qVar3;
  float (*pafVar4) [16];
  TestLog *this;
  MessageBuilder *pMVar5;
  int local_2a4;
  MessageBuilder local_280;
  int local_fc;
  int local_f8;
  int stateIndex;
  int refIndex;
  int x;
  int y;
  StateQueryMemoryWriteGuard<float[16]> state;
  bool transpose_local;
  GLfloat *values_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_postguard[0xe]._3_1_ = transpose;
  unique0x10000240 = values;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[16]> *)&x);
  pafVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&x);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,*pafVar4);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[16]> *)&x,testCtx);
  if (bVar2) {
    for (refIndex = 0; refIndex < 4; refIndex = refIndex + 1) {
      for (stateIndex = 0; stateIndex < 4; stateIndex = stateIndex + 1) {
        local_f8 = refIndex * 4 + stateIndex;
        if ((state.m_postguard[0xe]._3_1_ & 1) == 0) {
          local_2a4 = refIndex * 4 + stateIndex;
        }
        else {
          local_2a4 = stateIndex * 4 + refIndex;
        }
        local_fc = local_2a4;
        fVar1 = stack0xffffffffffffffd8[local_f8];
        pafVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&x);
        if ((fVar1 != (*pafVar4)[local_fc]) || (NAN(fVar1) || NAN((*pafVar4)[local_fc]))) {
          this = tcu::TestContext::getLog(testCtx);
          tcu::TestLog::operator<<(&local_280,this,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [21])"// ERROR: at index [")
          ;
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&refIndex);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])"][");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stateIndex);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"] expected ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,stack0xffffffffffffffd8 + local_f8);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2b8b5f6);
          pafVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&x);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,*pafVar4 + local_fc);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_280);
          qVar3 = tcu::TestContext::getTestResult(testCtx);
          if (qVar3 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}